

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O0

long __thiscall Permutazione::random(Permutazione *this)

{
  unsigned_short uVar1;
  int iVar2;
  ushort local_14;
  unsigned_short tmp;
  int valoreRandom;
  unsigned_short k;
  unsigned_short j;
  Permutazione *this_local;
  
  for (tmp = 0; tmp < this->dimensione; tmp = tmp + 1) {
    this->individuo[tmp] = tmp;
  }
  local_14 = this->dimensione;
  while (local_14 = local_14 - 1, local_14 != 0) {
    iVar2 = Random::randIntU(&genRand,0,(uint)local_14);
    uVar1 = this->individuo[iVar2];
    this->individuo[iVar2] = this->individuo[local_14];
    this->individuo[local_14] = uVar1;
  }
  return (ulong)local_14;
}

Assistant:

void Permutazione::random() {
	for (unsigned short j = 0; j < dimensione; j++) {
		individuo[j] = j;
	}

	for (unsigned short k = dimensione - 1; k > 0; k--) {
		int valoreRandom = genRand.randIntU(0, k);

		unsigned short tmp = individuo[valoreRandom];
		individuo[valoreRandom] = individuo[k];
		individuo[k] = tmp;
	}
}